

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::_InternalParse
          (GLMClassifier_DoubleArray *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  uint res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *ptr_00;
  pair<const_char_*,_unsigned_int> pVar4;
  double *local_38;
  
  local_38 = (double *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      res = (uint)bVar1;
      ptr_00 = (double *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
        if ((char)*(byte *)ptr_00 < '\0') {
          pVar4 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          ptr_00 = (double *)pVar4.first;
          res = pVar4.second;
        }
        else {
          ptr_00 = (double *)((long)local_38 + 2);
        }
      }
      local_38 = ptr_00;
      if ((res & 0xfffffff8) == 8) {
        if (res == 10) {
          local_38 = (double *)
                     google::protobuf::internal::PackedDoubleParser
                               (&this->value_,(char *)ptr_00,ctx);
          goto LAB_001fd8fb;
        }
        if (res != 9) goto LAB_001fd8ce;
        _internal_add_value(this,*ptr_00);
        local_38 = local_38 + 1;
      }
      else {
LAB_001fd8ce:
        if ((res == 0) || ((res & 7) == 4)) {
          if (ptr_00 == (double *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)ptr_00;
        }
        uVar2 = this_00->ptr_;
        if ((uVar2 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar2 & 0xfffffffffffffffc) + 8);
        }
        local_38 = (double *)
                   google::protobuf::internal::UnknownFieldParse(res,unknown,(char *)local_38,ctx);
LAB_001fd8fb:
        if (local_38 == (double *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_38;
}

Assistant:

const char* GLMClassifier_DoubleArray::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated double value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_value(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 9) {
          _internal_add_value(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}